

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Fault node;
  int iVar3;
  SocketAddress *pSVar4;
  void *pvVar5;
  Exception *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var6;
  undefined4 in_register_00000084;
  DatagramPortImpl *this_01;
  Fault f;
  OwnPromiseNode local_68;
  Fault local_60;
  DatagramPortImpl *local_58;
  NetworkAddressImpl *local_50;
  undefined1 local_48 [24];
  
  local_50 = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
  pp_Var6 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  pSVar4 = NetworkAddressImpl::chooseOneAddress(local_50);
  do {
    local_48._0_8_ =
         sendto(*(int *)(pp_Var6 + 1),__buf,__n,0,(sockaddr *)&(pSVar4->addr).generic,
                pSVar4->addrlen);
    if (-1 < (long)local_48._0_8_) {
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)this,(unsigned_long *)local_48);
      return (ssize_t)this;
    }
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  local_58 = this;
  if (iVar3 == 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_68);
    OVar2.ptr = local_68.ptr;
    pPVar1 = (PromiseArena *)
             ((SleepHooks *)&((local_68.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_68.ptr - (long)pPVar1) < 0x40) {
      pvVar5 = operator_new(0x400);
      this_01 = local_58;
      this_00 = (Exception *)((long)pvVar5 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,&local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1774:48)>
                 ::anon_class_32_3_b2634f1b_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3c0) = &PTR_destroy_006e2568;
      *(_func_int ***)((long)pvVar5 + 0x3e0) = pp_Var6;
      *(void **)((long)pvVar5 + 1000) = __buf;
      *(size_t *)((long)pvVar5 + 0x3f0) = __n;
      *(NetworkAddressImpl **)((long)pvVar5 + 0x3f8) = local_50;
      *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
    }
    else {
      ((SleepHooks *)&((local_68.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks =
           (_func_int **)0x0;
      this_00 = (Exception *)(local_68.ptr + -4);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,&local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1774:48)>
                 ::anon_class_32_3_b2634f1b_for_func::operator());
      OVar2.ptr[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_006e2568;
      OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var6;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = (PromiseArena *)__buf;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)__n;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)local_50;
      OVar2.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
      this_01 = local_58;
    }
    local_48._0_8_ = &DAT_004ddfe0;
    local_48._8_8_ = &DAT_004de03f;
    local_48._16_8_ = (Disposer *)0x4c0000058b;
    local_60.exception = this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this_01,(OwnPromiseNode *)&local_60,(SourceLocation *)local_48);
    node.exception = local_60.exception;
    if (local_60.exception != (Exception *)0x0) {
      local_60.exception = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    }
    OVar2.ptr = local_68.ptr;
    if ((UnixEventPort *)local_68.ptr != (UnixEventPort *)0x0) {
      local_68.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    return (ssize_t)this_01;
  }
  local_60.exception = (Exception *)0x0;
  local_48._0_8_ = (Disposer *)0x0;
  local_48._8_8_ = (PromiseFulfiller<void> *)0x0;
  kj::_::Debug::Fault::init
            (&local_60,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const byte> buffer, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer.begin(), buffer.size(), 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, &destination]() {
      return send(buffer, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}